

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteActions::~MADPComponentDiscreteActions(MADPComponentDiscreteActions *this)

{
  pointer puVar1;
  pointer pvVar2;
  pointer ppJVar3;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *this_00;
  _Base_ptr this_01;
  pointer this_02;
  pointer ppJVar4;
  
  this->_vptr_MADPComponentDiscreteActions =
       (_func_int **)&PTR__MADPComponentDiscreteActions_00610ce0;
  puVar1 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar1) {
    (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pvVar2 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (this->_m_actionVecs).
                 super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != pvVar2; this_02 = this_02 + 1
      ) {
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::clear(this_02);
  }
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::clear(&this->_m_actionVecs);
  ppJVar3 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar4 = (this->_m_jointActionVec).
                 super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppJVar4 != ppJVar3; ppJVar4 = ppJVar4 + 1
      ) {
    if (*ppJVar4 != (JointActionDiscrete *)0x0) {
      (*((*ppJVar4)->super_JointAction)._vptr_JointAction[1])();
    }
  }
  ppJVar4 = (this->_m_jointActionVec).
            super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_jointActionVec).
      super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppJVar4) {
    (this->_m_jointActionVec).
    super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppJVar4;
  }
  if (this->_m_jointActionIndices !=
      (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
       *)0x0) {
    while (this_00 = &this->_m_jointActionIndices->_M_t,
          (this_00->_M_impl).super__Rb_tree_header._M_node_count != 0) {
      this_01 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left[1]._M_parent;
      if (this_01 != (_Base_ptr)0x0) {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
      }
      operator_delete(this_01,0x18);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                          *)this->_m_jointActionIndices,
                         *(_Base_ptr *)
                          ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>*>>>
                            *)this->_m_jointActionIndices + 0x18));
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
    ::~_Rb_tree(this_00);
    operator_delete(this_00,0x30);
  }
  if (this->_m_actionStepSize != (size_t *)0x0) {
    operator_delete__(this->_m_actionStepSize);
  }
  std::
  vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
  ::~vector(&this->_m_actionVecs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::~_Vector_base
            (&(this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>);
  return;
}

Assistant:

MADPComponentDiscreteActions::~MADPComponentDiscreteActions()
{
    _m_nrActions.clear();
    vector<vector<ActionDiscrete> >::iterator it = _m_actionVecs.begin();
    vector<vector<ActionDiscrete> >::iterator last = _m_actionVecs.end();
    while(it != last)
    {
        // (*it) isa vector<ActionDiscrete>
        (*it).clear();
        it++;
    }
    _m_actionVecs.clear();
    vector<JointActionDiscrete*>::iterator it2 = _m_jointActionVec.begin();
    vector<JointActionDiscrete*>::iterator last2 = _m_jointActionVec.end();
    while(it2 != last2)
    {
        delete *it2; //removes the joint action pointed to...
        it2++;
    }
    _m_jointActionVec.clear();
    if(_m_jointActionIndices)
    {
        while(!_m_jointActionIndices->empty())
        {
            delete (*_m_jointActionIndices->begin()).second;
            _m_jointActionIndices->erase( _m_jointActionIndices->begin() );
        }
        delete _m_jointActionIndices;
    }
//     if(_m_jointActionIndices)
//     {
//         vector<vector<Index>*>::iterator it3 = _m_jointActionIndices->begin();
//         vector<vector<Index>*>::iterator last3 = _m_jointActionIndices->end();
//         while(it3 != last3)
//         {
//             delete *it3;
//             it3++;
//         }
//     }

    delete[] _m_actionStepSize;
}